

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall
CTextRender::TextDeferred(CTextRender *this,CTextCursor *pCursor,char *pText,int Length)

{
  vec2 ScreenScale_00;
  vec2 ScreenScale_01;
  int iVar1;
  int iVar2;
  int iVar3;
  FT_Face_conflict pFVar4;
  IGraphics *pIVar5;
  CScaledGlyph *pCVar6;
  int in_ECX;
  char *in_RDX;
  float *in_RSI;
  CTextRender *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  CWordWidthHint CVar11;
  int i_2;
  CScaledGlyph *pScaled;
  int i_1;
  float BackAdvanceX;
  int NumGlyphs_1;
  int NumDots;
  CWordWidthHint WordWidth_1;
  int OldMaxWidth;
  CScaledGlyph *pLastGlyph;
  float NextAdvanceY_2;
  bool ForceNewLine;
  int i;
  int WordStartGlyphIndex;
  float NextAdvanceY_1;
  float AdvanceY;
  int NumGlyphs;
  CWordWidthHint WordWidth;
  float WordStartAdvanceX;
  float NextAdvanceY;
  char *pEnd;
  char *pCur;
  int MaxLines;
  float MaxWidth;
  int Flags;
  int FontSizeIndex;
  int PixelSize;
  float Size;
  int ScreenHeight;
  int ScreenWidth;
  bool Render;
  vec2 ScreenScale;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  char aEllipsis [4];
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float fVar12;
  undefined4 in_stack_fffffffffffffed4;
  bool local_119;
  byte local_109;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int local_ec;
  float local_e8;
  float local_dc;
  int in_stack_ffffffffffffff34;
  CScaledGlyph *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffff58;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffff5c;
  float local_a0;
  int iStack_9c;
  int local_98;
  char *local_80;
  float local_78;
  float local_74;
  int local_54;
  vector2_base<float> local_24;
  float local_1c;
  float local_18;
  float local_14;
  float local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((uint)in_RSI[3] & 1) == 0) && (((uint)in_RSI[10] & 1) == 0)) &&
     (pFVar4 = CGlyphMap::GetDefaultFace(in_RDI->m_pGlyphMap), pFVar4 != (FT_Face_conflict)0x0)) {
    bVar7 = ((uint)in_RSI[0x16] & 1) == 0;
    pIVar5 = Graphics(in_RDI);
    iVar1 = IGraphics::ScreenWidth(pIVar5);
    pIVar5 = Graphics(in_RDI);
    iVar2 = IGraphics::ScreenHeight(pIVar5);
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[6])(pIVar5,local_10,&local_14,&local_18,&local_1c)
    ;
    vector2_base<float>::vector2_base
              (&local_24,(float)iVar1 / (local_18 - local_10[0]),
               (float)iVar2 / (local_1c - local_14));
    fVar8 = (float)(int)(in_RSI[0x12] * local_24.field_1.y) / local_24.field_1.y;
    CGlyphMap::GetFontSizeIndex(in_RDI->m_pGlyphMap,(int)(in_RSI[0x12] * local_24.field_1.y));
    fVar12 = in_RSI[0x16];
    local_74 = in_RSI[0x14];
    if (local_74 < 0.0) {
      local_74 = INFINITY;
    }
    local_78 = in_RSI[0x13];
    if ((int)local_78 < 0) {
      local_78 = (float)(int)((local_1c - local_14) / in_RSI[0x12]);
    }
    local_54 = in_ECX;
    if (in_ECX < 0) {
      local_54 = str_length((char *)0x142bae);
    }
    fVar9 = maximum<float>((float)(int)((in_RSI[9] + in_RSI[0x12]) * local_24.field_1.y) /
                           local_24.field_1.y,in_RSI[0xb]);
    in_RSI[0xb] = fVar9;
    local_80 = in_RDX;
    while( true ) {
      local_109 = 0;
      if (local_80 < in_RDX + local_54) {
        local_109 = *(byte *)(in_RSI + 3) ^ 0xff;
      }
      if ((local_109 & 1) == 0) break;
      fVar9 = in_RSI[8];
      ScreenScale_00.field_1 = in_stack_ffffffffffffff5c;
      ScreenScale_00.field_0 = in_stack_ffffffffffffff58;
      CVar11 = MakeWord((CTextRender *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                        ,(CTextCursor *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,local_dc._12_4_,
                        iVar3,ScreenScale_00);
      *(undefined1 *)(in_RSI + 0x18) = 0;
      iStack_9c = CVar11.m_CharCount;
      if (iStack_9c < 0) break;
      local_a0 = CVar11.m_EffectiveAdvanceX;
      if (local_74 < local_a0) {
        in_stack_ffffffffffffff5c =
             (anon_union_4_2_947302a4_for_vector2_base<float>_3)
             array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                       ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc));
        local_98 = CVar11.m_GlyphCount;
        if ((local_98 == 1) && (((*local_80 == ' ' || (*local_80 == '\n')) || (*local_80 == '\t'))))
        {
          if (bVar7) {
            array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                      ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffecc);
          }
          in_RSI[8] = fVar9;
        }
        else if ((int)in_RSI[4] < (int)local_78) {
          in_RSI[4] = (float)((int)in_RSI[4] + 1);
          in_stack_ffffffffffffff58 =
               (anon_union_4_2_94730284_for_vector2_base<float>_1)
               ((anon_union_4_2_94730284_for_vector2_base<float>_1 *)(in_RSI + 9))->x;
          in_RSI[9] = in_RSI[0x17] + in_RSI[0xb];
          in_RSI[8] = in_RSI[8] - fVar9;
          in_stack_ffffffffffffff54 =
               (float)(int)((in_RSI[9] + in_RSI[0x12]) * local_24.field_1.y) / local_24.field_1.y;
          fVar10 = maximum<float>(in_stack_ffffffffffffff54,in_RSI[0xb]);
          in_RSI[0xb] = fVar10;
          if (bVar7) {
            in_stack_ffffffffffffff50 = (int)in_stack_ffffffffffffff5c - local_98;
            in_stack_ffffffffffffff4c = in_stack_ffffffffffffff5c;
            while (in_stack_ffffffffffffff4c.y = in_stack_ffffffffffffff4c.y + -1,
                  in_stack_ffffffffffffff50 <= (int)in_stack_ffffffffffffff4c) {
              pCVar6 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                                 ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                                  (in_RSI + 0xc),(int)in_stack_ffffffffffffff4c);
              (pCVar6->m_Advance).field_0.x = (pCVar6->m_Advance).field_0.x - fVar9;
              fVar10 = in_RSI[9] - in_stack_ffffffffffffff58.x;
              pCVar6 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                                 ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                                  (in_RSI + 0xc),(int)in_stack_ffffffffffffff4c);
              (pCVar6->m_Advance).field_1.y = fVar10 + (pCVar6->m_Advance).field_1.y;
              fVar10 = in_RSI[4];
              pCVar6 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                                 ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                                  (in_RSI + 0xc),(int)in_stack_ffffffffffffff4c);
              pCVar6->m_Line = (int)fVar10 + -1;
            }
          }
          *(undefined1 *)(in_RSI + 0x18) = 0;
        }
        else {
          *(undefined1 *)(in_RSI + 3) = 1;
        }
      }
      fVar9 = maximum<float>(in_RSI[8],*in_RSI);
      *in_RSI = fVar9;
      local_119 = ((undefined1  [16])CVar11 & (undefined1  [16])0x100000000) !=
                  (undefined1  [16])0x0 && ((uint)fVar12 & 2) != 0;
      in_stack_ffffffffffffff48 = CONCAT13(local_119,(int3)in_stack_ffffffffffffff48);
      if ((local_119) ||
         (((undefined1  [16])CVar11 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0)) {
        if ((int)in_RSI[4] < (int)local_78) {
          in_RSI[4] = (float)((int)in_RSI[4] + 1);
          in_RSI[9] = in_RSI[0x17] + in_RSI[0xb];
          in_RSI[8] = 0.0;
          *(undefined1 *)(in_RSI + 0x18) = 1;
          in_stack_ffffffffffffff44 =
               (float)(int)((in_RSI[9] + in_RSI[0x12]) * local_24.field_1.y) / local_24.field_1.y;
          fVar9 = maximum<float>(in_stack_ffffffffffffff44,in_RSI[0xb]);
          in_RSI[0xb] = fVar9;
        }
        else {
          *(undefined1 *)(in_RSI + 3) = 1;
        }
      }
      local_80 = local_80 + iStack_9c;
    }
    in_RSI[1] = fVar8 * 0.35 + in_RSI[0xb];
    in_RSI[5] = (float)((int)local_80 - (int)in_RDX);
    if ((((uint)in_RSI[3] & 1) != 0) && (((uint)in_RSI[0x16] & 4) != 0)) {
      local_10[1] = 1.5290927e-38;
      iVar1 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                        ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc));
      if (0 < iVar1) {
        iVar1 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                          ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc));
        in_stack_ffffffffffffff38 =
             array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                       ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc),
                        iVar1 + -1);
        in_RSI[8] = in_stack_ffffffffffffff38->m_pGlyph->m_AdvanceX *
                    in_stack_ffffffffffffff38->m_Size +
                    (in_stack_ffffffffffffff38->m_Advance).field_0.x;
        *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)(in_RSI + 9) =
             (in_stack_ffffffffffffff38->m_Advance).field_1;
      }
      iVar1 = (int)in_RSI[0x14];
      in_RSI[0x14] = -1.0;
      ScreenScale_01.field_1 = in_stack_ffffffffffffff5c;
      ScreenScale_01.field_0 = in_stack_ffffffffffffff58;
      CVar11 = MakeWord((CTextRender *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                        ,(CTextCursor *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (char *)in_stack_ffffffffffffff38,iVar1,local_dc._12_4_,iVar3,ScreenScale_01
                       );
      in_RSI[0x14] = (float)iVar1;
      local_dc = CVar11.m_EffectiveAdvanceX;
      if (local_74 < local_dc) {
        iVar3 = CVar11.m_GlyphCount;
        local_ec = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                             ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                              (in_RSI + 0xc));
        local_ec = local_ec - iVar3;
        local_e8 = 0.0;
        while ((local_ec = local_ec + -1, 1 < local_ec &&
               (pCVar6 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                                   ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                                    (in_RSI + 0xc),local_ec),
               local_74 <
               pCVar6->m_pGlyph->m_AdvanceX * pCVar6->m_Size + (pCVar6->m_Advance).field_0.x))) {
          local_e8 = in_RSI[8] - (pCVar6->m_Advance).field_0.x;
          in_RSI[5] = (float)((int)in_RSI[5] - pCVar6->m_NumChars);
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                    ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc);
        }
        iVar1 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                          ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc));
        iVar1 = iVar1 - iVar3;
        while (in_stack_ffffffffffffff04 = iVar1,
              iVar3 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                                ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                                 (in_RSI + 0xc)), iVar1 < iVar3) {
          fVar12 = local_e8;
          pCVar6 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                             ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                              (in_RSI + 0xc),in_stack_ffffffffffffff04);
          (pCVar6->m_Advance).field_0.x = (pCVar6->m_Advance).field_0.x - fVar12;
          iVar1 = in_stack_ffffffffffffff04 + 1;
        }
      }
    }
    TextRefreshGlyphs((CTextRender *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (CTextCursor *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::TextDeferred(CTextCursor *pCursor, const char *pText, int Length)
{
	if(pCursor->m_Truncated || pCursor->m_SkipTextRender)
		return;

	if(!m_pGlyphMap->GetDefaultFace())
		return;

	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);

	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;
	int FontSizeIndex = m_pGlyphMap->GetFontSizeIndex(PixelSize);

	// Cursor current states
	int Flags = pCursor->m_Flags;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;
	int MaxLines = pCursor->m_MaxLines;
	if(MaxLines < 0)
		MaxLines = (ScreenY1-ScreenY0) / pCursor->m_FontSize;

	if(Length < 0)
		Length = str_length(pText);

	const char *pCur = (char *)pText;
	const char *pEnd = (char *)pText + Length;

	float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
	NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
	pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

	while(pCur < pEnd && !pCursor->m_Truncated)
	{
		const float WordStartAdvanceX = pCursor->m_Advance.x;
		CWordWidthHint WordWidth = MakeWord(pCursor, pCur, pEnd, FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_StartOfLine = false;
		if(WordWidth.m_CharCount < 0)
			break;
		
		// word wrapping
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			const int NumGlyphs = pCursor->m_Glyphs.size();
			// do not let space create new line.
			if(WordWidth.m_GlyphCount == 1 && (*pCur == ' ' || *pCur == '\n' || *pCur == '\t'))
			{
				if(Render)
					pCursor->m_Glyphs.remove_index(NumGlyphs-1);
				pCursor->m_Advance.x = WordStartAdvanceX;
			}
			else
			{
				if(pCursor->m_LineCount < MaxLines)
				{
					pCursor->m_LineCount++;
					float AdvanceY = pCursor->m_Advance.y;
					pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
					pCursor->m_Advance.x -= WordStartAdvanceX;

					float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
					NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
					pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

					if(Render)
					{
						const int WordStartGlyphIndex = NumGlyphs - WordWidth.m_GlyphCount;
						for(int i = NumGlyphs - 1; i >= WordStartGlyphIndex; --i)
						{
							pCursor->m_Glyphs[i].m_Advance.x -= WordStartAdvanceX;
							pCursor->m_Glyphs[i].m_Advance.y += pCursor->m_Advance.y - AdvanceY;
							pCursor->m_Glyphs[i].m_Line = pCursor->m_LineCount - 1;
						}
					}

					pCursor->m_StartOfLine = false;
				}
				else
				{
					pCursor->m_Truncated = true;
				}
			}
		}

		pCursor->m_Width = maximum(pCursor->m_Advance.x, pCursor->m_Width);

		// newline \n
		bool ForceNewLine = WordWidth.m_EndsWithNewline && (Flags & TEXTFLAG_ALLOW_NEWLINE);
		if(ForceNewLine || WordWidth.m_IsBroken)
		{
			if(pCursor->m_LineCount < MaxLines)
			{
				pCursor->m_LineCount++;
				pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
				pCursor->m_Advance.x = 0;
				pCursor->m_StartOfLine = true;

				float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
				NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
				pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);
			}
			else
			{
				pCursor->m_Truncated = true;
			}
		}

		pCur += WordWidth.m_CharCount;
	}

	pCursor->m_Height = pCursor->m_NextLineAdvanceY + 0.35f * Size;
	pCursor->m_CharCount = pCur - pText;

	// insert ellipsis at the end
	if(pCursor->m_Truncated && pCursor->m_Flags & TEXTFLAG_ELLIPSIS)
	{
		const char aEllipsis[] = "…";
		if(pCursor->m_Glyphs.size() > 0)
		{
			CScaledGlyph *pLastGlyph = &pCursor->m_Glyphs[pCursor->m_Glyphs.size()-1];
			pCursor->m_Advance.x = pLastGlyph->m_Advance.x + pLastGlyph->m_pGlyph->m_AdvanceX * pLastGlyph->m_Size;
			pCursor->m_Advance.y = pLastGlyph->m_Advance.y;
		}

		int OldMaxWidth = pCursor->m_MaxWidth;
		pCursor->m_MaxWidth = -1;
		CWordWidthHint WordWidth = MakeWord(pCursor, aEllipsis, aEllipsis+sizeof(aEllipsis), FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_MaxWidth = OldMaxWidth;
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			int NumDots = WordWidth.m_GlyphCount;
			int NumGlyphs = pCursor->m_Glyphs.size() - NumDots;
			float BackAdvanceX = 0;
			for(int i = NumGlyphs - 1; i > 1; --i)
			{
				CScaledGlyph *pScaled = &pCursor->m_Glyphs[i];
				if(pScaled->m_Advance.x + pScaled->m_pGlyph->m_AdvanceX * pScaled->m_Size > MaxWidth)
				{
					BackAdvanceX = pCursor->m_Advance.x - pScaled->m_Advance.x;
					pCursor->m_CharCount -= pScaled->m_NumChars;
					pCursor->m_Glyphs.remove_index(i);
				}
				else
					break;
			}
			for(int i = pCursor->m_Glyphs.size() - NumDots; i < pCursor->m_Glyphs.size(); ++i)
				pCursor->m_Glyphs[i].m_Advance.x -= BackAdvanceX;
		}
	}

	TextRefreshGlyphs(pCursor);
}